

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_future.cpp
# Opt level: O2

Read<double> __thiscall Omega_h::Future<double>::get(Future<double> *this)

{
  void *extraout_RDX;
  long in_RSI;
  Read<double> RVar1;
  Write<double> WStack_28;
  
  if (*(int *)(in_RSI + 0x58) == 1) {
    *(undefined4 *)(in_RSI + 0x58) = 2;
    Write<double>::Write(&WStack_28,(Write<double> *)(in_RSI + 0x10));
    std::function<Omega_h::Read<double>_(Omega_h::Write<double>)>::operator()
              ((function<Omega_h::Read<double>_(Omega_h::Write<double>)> *)this,
               (Write<double> *)(in_RSI + 0x20));
    Write<double>::~Write(&WStack_28);
    RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<double>)RVar1.write_.shared_alloc_;
  }
  fail("Can not ask the result more than once.");
}

Assistant:

Read<T> Future<T>::get() {
  if (status_ == Status::completed) {
    status_ = Status::consumed;
    return callback_(recvbuf_);
#ifdef OMEGA_H_USE_MPI
  } else if (status_ == Status::waiting) {
    OMEGA_H_CHECK(MPI_SUCCESS == MPI_Waitall(static_cast<int>(requests_.size()),
                                     requests_.data(), MPI_STATUS_IGNORE));
    status_ = Status::consumed;
    return callback_(recvbuf_);
#endif  // !OMEGA_H_USE_MPI
  } else {
    fail("Can not ask the result more than once.");
  }
}